

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdAddTxPeginInput(void *handle,void *create_handle,char *txid,uint32_t vout,int64_t amount,
                      char *asset,char *mainchain_genesis_block_hash,char *claim_script,
                      char *mainchain_tx_hex,char *txout_proof)

{
  ConfidentialTransactionContext *this;
  CfdException *pCVar1;
  bool is_bitcoin;
  allocator local_1c5;
  allocator local_1c4;
  allocator local_1c3;
  allocator local_1c2;
  allocator local_1c1;
  Script local_1c0;
  void *local_188;
  OutPoint outpoint;
  ConfidentialAssetId local_158;
  string local_130;
  string local_110;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_f0;
  string local_d8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  string local_a0;
  string local_80;
  BlockHash local_60;
  Amount local_40;
  
  local_188 = handle;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&local_1c0,"TransactionData",(allocator *)&outpoint);
  cfd::capi::CheckBuffer(create_handle,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  if (txid == (char *)0x0) {
    local_1c0._vptr_Script = (_func_int **)0x4fbb12;
    local_1c0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb74;
    local_1c0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdAddTxPeginInput";
    cfd::core::logger::warn<>((CfdSourceLocation *)&local_1c0,"txid is null.");
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_1c0,"Failed to parameter. txid is null.",(allocator *)&outpoint);
    cfd::core::CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,(string *)&local_1c0);
    __cxa_throw(pCVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (asset == (char *)0x0) {
    local_1c0._vptr_Script = (_func_int **)0x4fbb12;
    local_1c0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb7a;
    local_1c0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdAddTxPeginInput";
    cfd::core::logger::warn<>((CfdSourceLocation *)&local_1c0,"asset is null.");
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_1c0,"Failed to parameter. asset is null.",(allocator *)&outpoint);
    cfd::core::CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,(string *)&local_1c0);
    __cxa_throw(pCVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (mainchain_genesis_block_hash == (char *)0x0) {
    local_1c0._vptr_Script = (_func_int **)0x4fbb12;
    local_1c0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb80;
    local_1c0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdAddTxPeginInput";
    cfd::core::logger::warn<>
              ((CfdSourceLocation *)&local_1c0,"mainchain_genesis_block_hash is null.");
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_1c0,"Failed to parameter. mainchain_genesis_block_hash is null.",
               (allocator *)&outpoint);
    cfd::core::CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,(string *)&local_1c0);
    __cxa_throw(pCVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (claim_script == (char *)0x0) {
    local_1c0._vptr_Script = (_func_int **)0x4fbb12;
    local_1c0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb86;
    local_1c0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdAddTxPeginInput";
    cfd::core::logger::warn<>((CfdSourceLocation *)&local_1c0,"claim_script is null.");
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_1c0,"Failed to parameter. claim_script is null.",
               (allocator *)&outpoint);
    cfd::core::CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,(string *)&local_1c0);
    __cxa_throw(pCVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (mainchain_tx_hex == (char *)0x0) {
    local_1c0._vptr_Script = (_func_int **)0x4fbb12;
    local_1c0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb8c;
    local_1c0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdAddTxPeginInput";
    cfd::core::logger::warn<>((CfdSourceLocation *)&local_1c0,"mainchain_tx_hex is null.");
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_1c0,"Failed to parameter. mainchain_tx_hex is null.",
               (allocator *)&outpoint);
    cfd::core::CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,(string *)&local_1c0);
    __cxa_throw(pCVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (txout_proof == (char *)0x0) {
    local_1c0._vptr_Script = (_func_int **)0x4fbb12;
    local_1c0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb92;
    local_1c0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "CfdAddTxPeginInput";
    cfd::core::logger::warn<>((CfdSourceLocation *)&local_1c0,"txout_proof is null.");
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_1c0,"Failed to parameter. txout_proof is null.",
               (allocator *)&outpoint);
    cfd::core::CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,(string *)&local_1c0);
    __cxa_throw(pCVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  is_bitcoin = false;
  cfd::capi::ConvertNetType(*(int *)((long)create_handle + 0x10),&is_bitcoin);
  this = *(ConfidentialTransactionContext **)((long)create_handle + 0x18);
  if (this == (ConfidentialTransactionContext *)0x0) {
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_1c0,"Invalid handle state. tx is null",(allocator *)&outpoint);
    cfd::core::CfdException::CfdException(pCVar1,kCfdIllegalStateError,(string *)&local_1c0);
    __cxa_throw(pCVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (is_bitcoin != true) {
    std::__cxx11::string::string((string *)&local_158,txid,(allocator *)&local_130);
    cfd::core::Txid::Txid((Txid *)&local_1c0,(string *)&local_158);
    cfd::core::OutPoint::OutPoint(&outpoint,(Txid *)&local_1c0,vout);
    cfd::core::Txid::~Txid((Txid *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_158);
    cfd::core::Amount::Amount(&local_40,amount);
    std::__cxx11::string::string((string *)&local_130,asset,&local_1c1);
    cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_158,&local_130);
    std::__cxx11::string::string((string *)&local_80,mainchain_genesis_block_hash,&local_1c2);
    cfd::core::BlockHash::BlockHash(&local_60,&local_80);
    std::__cxx11::string::string((string *)&local_a0,claim_script,&local_1c3);
    cfd::core::Script::Script(&local_1c0,&local_a0);
    std::__cxx11::string::string((string *)&local_d8,mainchain_tx_hex,&local_1c4);
    cfd::core::ByteData::ByteData((ByteData *)&local_b8,&local_d8);
    std::__cxx11::string::string((string *)&local_110,txout_proof,&local_1c5);
    cfd::core::ByteData::ByteData((ByteData *)&local_f0,&local_110);
    cfd::ConfidentialTransactionContext::AddPeginTxIn
              (this,&outpoint,&local_40,&local_158,&local_60,&local_1c0,(ByteData *)&local_b8,
               (ByteData *)&local_f0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    cfd::core::Script::~Script(&local_1c0);
    std::__cxx11::string::~string((string *)&local_a0);
    cfd::core::BlockHash::~BlockHash(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_158);
    std::__cxx11::string::~string((string *)&local_130);
    cfd::core::Txid::~Txid(&outpoint.txid_);
    return 0;
  }
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&local_1c0,"Invalid handle state. tx is bitcoin.",(allocator *)&outpoint);
  cfd::core::CfdException::CfdException(pCVar1,kCfdIllegalStateError,(string *)&local_1c0);
  __cxa_throw(pCVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddTxPeginInput(
    void* handle, void* create_handle, const char* txid, uint32_t vout,
    int64_t amount, const char* asset,
    const char* mainchain_genesis_block_hash, const char* claim_script,
    const char* mainchain_tx_hex, const char* txout_proof) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if (txid == nullptr) {
      warn(CFD_LOG_SOURCE, "txid is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null.");
    }
    if (asset == nullptr) {
      warn(CFD_LOG_SOURCE, "asset is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. asset is null.");
    }
    if (mainchain_genesis_block_hash == nullptr) {
      warn(CFD_LOG_SOURCE, "mainchain_genesis_block_hash is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. mainchain_genesis_block_hash is null.");
    }
    if (claim_script == nullptr) {
      warn(CFD_LOG_SOURCE, "claim_script is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. claim_script is null.");
    }
    if (mainchain_tx_hex == nullptr) {
      warn(CFD_LOG_SOURCE, "mainchain_tx_hex is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. mainchain_tx_hex is null.");
    }
    if (txout_proof == nullptr) {
      warn(CFD_LOG_SOURCE, "txout_proof is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txout_proof is null.");
    }

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. tx is bitcoin.");
    }

    ConfidentialTransactionContext* tx =
        static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
    OutPoint outpoint(Txid(txid), vout);
    tx->AddPeginTxIn(
        outpoint, Amount(amount), ConfidentialAssetId(asset),
        BlockHash(mainchain_genesis_block_hash), Script(claim_script),
        ByteData(mainchain_tx_hex), ByteData(txout_proof));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}